

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O2

void __thiscall QBuffer::QBuffer(QBuffer *this,QObject *parent)

{
  QObjectData *pQVar1;
  QBufferPrivate *this_00;
  
  this_00 = (QBufferPrivate *)operator_new(0x1b8);
  QBufferPrivate::QBufferPrivate(this_00);
  QIODevice::QIODevice(&this->super_QIODevice,(QIODevicePrivate *)this_00,parent);
  (this->super_QIODevice).super_QObject._vptr_QObject = (_func_int **)&PTR_metaObject_00660cb8;
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  pQVar1[4].bindingStorage.bindingStatus = (QBindingStatus *)(pQVar1 + 5);
  return;
}

Assistant:

QBuffer::QBuffer(QObject *parent)
    : QIODevice(*new QBufferPrivate, parent)
{
    Q_D(QBuffer);
    d->buf = &d->defaultBuf;
}